

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O2

void __thiscall
test_matrix_dense_matrix_matrix_subtraction_assignment_Test::
test_matrix_dense_matrix_matrix_subtraction_assignment_Test
          (test_matrix_dense_matrix_matrix_subtraction_assignment_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00171fd0;
  return;
}

Assistant:

TEST(test_matrix_dense, matrix_matrix_subtraction_assignment) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_1 = {{2, 2}, {3, 3}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_0 = {{10, 20}, {30, 40}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_1 = {{20, 20}, {30, 30}};

  dynamic_matrix_0 -= dynamic_matrix_1;
  static_matrix_0 -= static_matrix_1;
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][0], -1);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[0][1], 0);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][0], 0);
  EXPECT_DOUBLE_EQ(dynamic_matrix_0[1][1], 1);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][0], -10);
  EXPECT_DOUBLE_EQ(static_matrix_0[0][1], 0);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][0], 0);
  EXPECT_DOUBLE_EQ(static_matrix_0[1][1], 10);

  dynamic_matrix_1 -= static_matrix_0;
  static_matrix_1 -= dynamic_matrix_0;
  EXPECT_DOUBLE_EQ(dynamic_matrix_1[0][0], 12);
  EXPECT_DOUBLE_EQ(dynamic_matrix_1[0][1], 2);
  EXPECT_DOUBLE_EQ(dynamic_matrix_1[1][0], 3);
  EXPECT_DOUBLE_EQ(dynamic_matrix_1[1][1], -7);
  EXPECT_DOUBLE_EQ(static_matrix_1[0][0], 21);
  EXPECT_DOUBLE_EQ(static_matrix_1[0][1], 20);
  EXPECT_DOUBLE_EQ(static_matrix_1[1][0], 30);
  EXPECT_DOUBLE_EQ(static_matrix_1[1][1], 29);

  Matrix_Dense<Scalar, 0, 0> dynamic_incorrect;
  Matrix_Dense<Scalar, 2, 3> static_incorrect;
  EXPECT_DEATH(dynamic_matrix_0 -= dynamic_incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_0 -= static_incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_0 -= dynamic_incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_0 -= static_incorrect, "./*");
}